

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int iTarget)

{
  int p1;
  Expr *pX_00;
  Vdbe *p;
  u8 uVar1;
  int iVar2;
  int iVar3;
  InLoop *pIVar4;
  bool bVar5;
  u8 bRev;
  InLoop *pIn;
  int iTab;
  int eType;
  int iReg;
  Vdbe *v;
  Expr *pX;
  int iTarget_local;
  int iEq_local;
  WhereLevel *pLevel_local;
  WhereTerm *pTerm_local;
  Parse *pParse_local;
  
  pX_00 = pTerm->pExpr;
  p = pParse->pVdbe;
  if (pX_00->op == 'L') {
    iTab = sqlite3ExprCodeTarget(pParse,pX_00->pRight,iTarget);
  }
  else {
    iTab = iTarget;
    if (pX_00->op == 'I') {
      sqlite3VdbeAddOp2(p,10,0,iTarget);
    }
    else {
      bVar5 = ((pLevel->plan).wsFlags & 0x1000000) != 0;
      if ((((pLevel->plan).wsFlags & 0xf0000) != 0) &&
         (((pLevel->plan).u.pIdx)->aSortOrder[iEq] != '\0')) {
        bVar5 = !bVar5;
      }
      iVar2 = sqlite3FindInIndex(pParse,pX_00,(int *)0x0);
      if (iVar2 == 4) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      p1 = pX_00->iTable;
      iVar3 = 0x48;
      if (bVar5) {
        iVar3 = 0x43;
      }
      sqlite3VdbeAddOp2(p,iVar3,p1,0);
      if ((pLevel->u).in.nIn == 0) {
        iVar3 = sqlite3VdbeMakeLabel(p);
        pLevel->addrNxt = iVar3;
      }
      (pLevel->u).in.nIn = (pLevel->u).in.nIn + 1;
      pIVar4 = (InLoop *)
               sqlite3DbReallocOrFree(pParse->db,(pLevel->u).in.aInLoop,(pLevel->u).in.nIn * 0xc);
      (pLevel->u).in.aInLoop = pIVar4;
      pIVar4 = (pLevel->u).in.aInLoop;
      if (pIVar4 == (InLoop *)0x0) {
        (pLevel->u).in.nIn = 0;
      }
      else {
        pIVar4 = pIVar4 + ((pLevel->u).in.nIn + -1);
        pIVar4->iCur = p1;
        if (iVar2 == 1) {
          iVar2 = sqlite3VdbeAddOp2(p,0x41,p1,iTarget);
          pIVar4->addrInTop = iVar2;
        }
        else {
          iVar2 = sqlite3VdbeAddOp3(p,0x1d,p1,0,iTarget);
          pIVar4->addrInTop = iVar2;
        }
        uVar1 = '_';
        if (bVar5) {
          uVar1 = '\\';
        }
        pIVar4->eEndLoopOp = uVar1;
        sqlite3VdbeAddOp1(p,0x49,iTarget);
      }
    }
  }
  disableTerm(pLevel,pTerm);
  return iTab;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( iTarget>0 );
  if( pX->op==TK_EQ ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType;
    int iTab;
    struct InLoop *pIn;
    u8 bRev = (pLevel->plan.wsFlags & WHERE_REVERSE)!=0;

    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 
      && pLevel->plan.u.pIdx->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( iEq==pLevel->plan.u.pIdx->nColumn-1 );
      testcase( iEq>0 && iEq+1<pLevel->plan.u.pIdx->nColumn );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;
    eType = sqlite3FindInIndex(pParse, pX, 0);
    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    assert( pLevel->plan.wsFlags & WHERE_IN_ABLE );
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }
    pLevel->u.in.nIn++;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      pIn += pLevel->u.in.nIn - 1;
      pIn->iCur = iTab;
      if( eType==IN_INDEX_ROWID ){
        pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iReg);
      }else{
        pIn->addrInTop = sqlite3VdbeAddOp3(v, OP_Column, iTab, 0, iReg);
      }
      pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
      sqlite3VdbeAddOp1(v, OP_IsNull, iReg);
    }else{
      pLevel->u.in.nIn = 0;
    }
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}